

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O0

vec<3U,_float> * __thiscall
crnlib::vec<3u,float>::operator=(vec<3u,float> *this,vec<3U,_double> *other)

{
  uint uVar1;
  double dVar2;
  uint local_28;
  uint i;
  uint s;
  vec<3U,_double> *other_local;
  vec<3U,_float> *this_local;
  
  if (this != (vec<3u,float> *)other) {
    uVar1 = math::minimum<unsigned_int>(3,3);
    for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
      dVar2 = vec<3U,_double>::operator[](other,local_28);
      *(float *)(this + (ulong)local_28 * 4) = (float)dVar2;
    }
    for (; local_28 < 3; local_28 = local_28 + 1) {
      *(undefined4 *)(this + (ulong)local_28 * 4) = 0;
    }
  }
  return (vec<3U,_float> *)this;
}

Assistant:

inline vec& operator=(const vec<O, U>& other)
        {
            if ((void*)this == (void*)&other)
            {
                return *this;
            }

            uint s = math::minimum(N, O);

            uint i;
            for (i = 0; i < s; i++)
            {
                m_s[i] = static_cast<T>(other[i]);
            }

            for (; i < N; i++)
            {
                m_s[i] = 0;
            }

            return *this;
        }